

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O0

int rb_compare_leaflists(lyd_node *n1,lyd_node *n2)

{
  int iVar1;
  ly_ctx *local_30;
  lyd_value *val2;
  lyd_value *val1;
  lyd_node *n2_local;
  lyd_node *n1_local;
  
  if (n2->schema->nodetype != 8) {
    __assert_fail("n2->schema->nodetype == LYS_LEAFLIST",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_sorted.c"
                  ,0xd9,"int rb_compare_leaflists(const struct lyd_node *, const struct lyd_node *)"
                 );
  }
  if (n1->schema->nodetype == 8) {
    if (n1->schema == (lysc_node *)0x0) {
      local_30 = (ly_ctx *)n1[2].schema;
    }
    else {
      local_30 = n1->schema->module->ctx;
    }
    iVar1 = rb_sort_clb(local_30,(lyd_value *)(n1 + 1),(lyd_value *)(n2 + 1));
    return iVar1;
  }
  __assert_fail("n1->schema->nodetype == LYS_LEAFLIST",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_sorted.c"
                ,0xda,"int rb_compare_leaflists(const struct lyd_node *, const struct lyd_node *)");
}

Assistant:

static int
rb_compare_leaflists(const struct lyd_node *n1, const struct lyd_node *n2)
{
    struct lyd_value *val1, *val2;

    /* compare leaf-list values */
    assert(n2->schema->nodetype == LYS_LEAFLIST);
    assert(n1->schema->nodetype == LYS_LEAFLIST);

    val1 = &((struct lyd_node_term *)n1)->value;
    val2 = &((struct lyd_node_term *)n2)->value;
    return rb_sort_clb(LYD_CTX(n1), val1, val2);
}